

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.hpp
# Opt level: O3

int Lodtalk::identityHashOf(Oop obj)

{
  uint uVar1;
  
  if (((ulong)obj.field_0 & 1) != 0) {
    return (int)((ulong)obj.field_0 >> 1);
  }
  uVar1 = obj.field_0._0_4_ & 6;
  if ((uVar1 != 4) && (uVar1 != 2)) {
    return *(uint *)obj.field_0 >> 10;
  }
  return (int)((ulong)obj.field_0 >> 3);
}

Assistant:

inline int identityHashOf(Oop obj)
{
	if(obj.isSmallInteger())
		return (int)obj.decodeSmallInteger();
    else if (obj.isCharacter())
        return obj.decodeCharacter();
    else if (obj.isSmallFloat())
        return int(obj.uintValue >> ObjectTag::SmallFloatShift);
	return obj.header->identityHash;
}